

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O3

Matcher * __thiscall
trivialre::re_compiler::C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy>::
CompileOrDie_abi_cxx11_
          (Matcher *__return_storage_ptr__,
          C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *this,string_view str)

{
  string_view msg;
  string_view at;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  size_t local_30;
  char *local_28;
  
  *(size_t *)this = str._M_len;
  *(char **)(this + 8) = str._M_str;
  ParseAlt_abi_cxx11_((ParseResult *)&local_58,this,str);
  if (local_30 != 0) {
    msg._M_str = "failed to parse entire re string";
    msg._M_len = 0x20;
    at._M_str = local_28;
    at._M_len = local_30;
    ErrorPolicy::NoteError((ErrorPolicy *)this,msg,at);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38 == false) {
    (__return_storage_ptr__->field_2)._M_local_buf[4] = '>';
    *(undefined4 *)&__return_storage_ptr__->field_2 = 0x796e613c;
    __return_storage_ptr__->_M_string_length = 5;
    (__return_storage_ptr__->field_2)._M_local_buf[5] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_value._M_dataplus._M_p,
               (pointer)(local_58._M_value._M_string_length +
                        (long)local_58._M_value._M_dataplus._M_p));
  }
  if ((local_38 & 1U) != 0) {
    local_38 = false;
    if (local_58._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_58._M_value + 0x10)) {
      operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matcher CompileOrDie(std::string_view str) {
    ErrorPolicy::StartedParsing(str);
    auto [maybe_m, new_str] = ParseAlt(str);
    if (!new_str.empty()) {
      ErrorPolicy::NoteError("failed to parse entire re string", new_str);
    }
    if (!maybe_m) {
      return builder.Any();
    }
    return maybe_m.value();
  }